

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int read_chars(lua_State *L,FILE *f,size_t n)

{
  uint uVar1;
  char *__ptr;
  size_t sVar2;
  size_t sVar3;
  ulong __n;
  luaL_Buffer b;
  
  b.p = b.buffer;
  b.lvl = 0;
  __n = 0x2000;
  b.L = L;
  do {
    __ptr = luaL_prepbuffer(&b);
    if (n <= __n) {
      __n = n;
    }
    sVar2 = fread(__ptr,1,__n,(FILE *)f);
    b.p = b.p + sVar2;
    n = n - sVar2;
  } while ((sVar2 == __n) && (n != 0));
  luaL_pushresult(&b);
  if (n == 0) {
    uVar1 = 1;
  }
  else {
    sVar3 = lua_objlen(L,-1);
    uVar1 = (uint)(sVar3 != 0);
  }
  return uVar1;
}

Assistant:

static int read_chars(lua_State*L,FILE*f,size_t n){
size_t rlen;
size_t nr;
luaL_Buffer b;
luaL_buffinit(L,&b);
rlen=BUFSIZ;
do{
char*p=luaL_prepbuffer(&b);
if(rlen>n)rlen=n;
nr=fread(p,sizeof(char),rlen,f);
luaL_addsize(&b,nr);
n-=nr;
}while(n>0&&nr==rlen);
luaL_pushresult(&b);
return(n==0||lua_objlen(L,-1)>0);
}